

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O0

int ravi_validation(lua_State *L)

{
  int iVar1;
  int b;
  int value;
  int oldvalue;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  b = raviV_getvalidation(L);
  if (iVar1 == 1) {
    iVar1 = lua_toboolean(L,1);
    raviV_setvalidation(L,iVar1);
  }
  lua_pushboolean(L,b);
  return 1;
}

Assistant:

static int ravi_validation(lua_State *L) {
  int n = lua_gettop(L);
  int oldvalue = raviV_getvalidation(L);
  if (n == 1) {
    int value = lua_toboolean(L, 1);
    raviV_setvalidation(L, value);
  }
  lua_pushboolean(L, oldvalue);
  return 1;
}